

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O3

void __thiscall
chrono::
ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
::Build_Cq(ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           *this,ChSparseMatrix *storage,int insrow)

{
  int iVar1;
  ChVariables *pCVar2;
  int j;
  long lVar3;
  
  pCVar2 = (this->tuple_a).variables;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                 m_storage.m_data.array[lVar3],storage,(ulong)(uint)insrow,
                 (ulong)(uint)(iVar1 + (int)lVar3),1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  pCVar2 = (this->tuple_b).variables;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                 m_storage.m_data.array[lVar3],storage,(ulong)(uint)insrow,
                 (ulong)(uint)(iVar1 + (int)lVar3),1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  return;
}

Assistant:

virtual void Build_Cq(ChSparseMatrix& storage, int insrow) override {
        tuple_a.Build_Cq(storage, insrow);
        tuple_b.Build_Cq(storage, insrow);
    }